

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void duckdb::RandomFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  idx_t i;
  ulong uVar2;
  undefined8 uVar3;
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = *(FunctionLocalState **)(state + 0xb0);
  optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_28);
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  for (uVar2 = 0; uVar2 < *(ulong *)(args + 0x18); uVar2 = uVar2 + 1) {
    uVar3 = duckdb::RandomEngine::NextRandom();
    *(undefined8 *)(lVar1 + uVar2 * 8) = uVar3;
  }
  return;
}

Assistant:

static void RandomFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<double>(result);
	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = lstate.random_engine.NextRandom();
	}
}